

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

void __thiscall
TTD::ExecutionInfoManager::AddCurrentLocationDuringScan
          (ExecutionInfoManager *this,int64 topLevelEventTime)

{
  undefined8 topLevelETime;
  bool bVar1;
  SingleCallCounter *callFrame;
  undefined1 local_58 [8];
  TTDebuggerSourceLocation current;
  int64 topLevelEventTime_local;
  ExecutionInfoManager *this_local;
  
  current._56_8_ = topLevelEventTime;
  TTDebuggerSourceLocation::TTDebuggerSourceLocation((TTDebuggerSourceLocation *)local_58);
  topLevelETime = current._56_8_;
  callFrame = JsUtil::
              List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Last(&this->m_callStack);
  TTDebuggerSourceLocation::SetLocationFromFrame
            ((TTDebuggerSourceLocation *)local_58,topLevelETime,callFrame);
  bVar1 = TTDebuggerSourceLocation::HasValue(&this->m_activeTTDBP);
  if ((bVar1) &&
     (bVar1 = TTDebuggerSourceLocation::AreSameLocations
                        (&this->m_activeTTDBP,(TTDebuggerSourceLocation *)local_58), bVar1)) {
    this->m_hitContinueSearchBP = true;
  }
  if (((this->m_hitContinueSearchBP & 1U) == 0) &&
     (bVar1 = IsLocationActiveBPAndNotExplicitBP(this,(TTDebuggerSourceLocation *)local_58), !bVar1)
     ) {
    TTDebuggerSourceLocation::SetLocationCopy
              (&this->m_continueBreakPoint,(TTDebuggerSourceLocation *)local_58);
  }
  TTDebuggerSourceLocation::~TTDebuggerSourceLocation((TTDebuggerSourceLocation *)local_58);
  return;
}

Assistant:

void ExecutionInfoManager::AddCurrentLocationDuringScan(int64 topLevelEventTime)
    {
        TTDebuggerSourceLocation current;
        current.SetLocationFromFrame(topLevelEventTime, this->m_callStack.Last());

        if(this->m_activeTTDBP.HasValue() && TTDebuggerSourceLocation::AreSameLocations(this->m_activeTTDBP, current))
        {
            this->m_hitContinueSearchBP = true;
        }

        if(!this->m_hitContinueSearchBP && !this->IsLocationActiveBPAndNotExplicitBP(current))
        {
            this->m_continueBreakPoint.SetLocationCopy(current);
        }
    }